

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O2

bool glu::
     isValidTypePath<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
               (VarType *type,
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               begin,__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                     end)

{
  Type TVar1;
  Type TVar2;
  pointer pSVar3;
  int iVar4;
  DataType dataType;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  _Var5;
  
  do {
    _Var5._M_current = end._M_current;
    if (begin._M_current == end._M_current) {
LAB_00428e29:
      return _Var5._M_current == end._M_current;
    }
    TVar1 = (begin._M_current)->type;
    TVar2 = type->m_type;
    if (TVar1 == ARRAY_ELEMENT) {
      if (TVar2 != TYPE_ARRAY) {
        return false;
      }
      iVar4 = (type->m_data).array.size;
      if (iVar4 != -1) {
        if ((begin._M_current)->index < 0) {
          return false;
        }
        if (iVar4 <= (begin._M_current)->index) {
          return false;
        }
      }
      type = (type->m_data).array.elementType;
    }
    else {
      if (TVar1 != STRUCT_MEMBER) {
        if (TVar2 == TYPE_BASIC) {
          dataType = (type->m_data).basic.type;
          if (TVar1 == MATRIX_COLUMN) {
            if (8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) {
              return false;
            }
            iVar4 = getDataTypeMatrixNumRows(dataType);
            dataType = getDataTypeFloatVec(iVar4);
            begin._M_current = begin._M_current + 1;
          }
          if ((begin._M_current == end._M_current) ||
             (_Var5._M_current = begin._M_current, (begin._M_current)->type != VECTOR_COMPONENT))
          goto LAB_00428e29;
          if (((dataType < TYPE_BOOL) && ((0x77003801cU >> ((ulong)dataType & 0x3f) & 1) != 0)) ||
             (dataType - TYPE_BOOL_VEC2 < 3)) {
            getDataTypeScalarType(dataType);
            _Var5._M_current = begin._M_current + 1;
            goto LAB_00428e29;
          }
        }
        return false;
      }
      if (TVar2 != TYPE_STRUCT) {
        return false;
      }
      iVar4 = (begin._M_current)->index;
      pSVar3 = (((type->m_data).structPtr)->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)iVar4 < 0) {
        return false;
      }
      if ((int)(((long)(((type->m_data).structPtr)->m_members).
                       super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x38) <= iVar4) {
        return false;
      }
      type = &pSVar3[iVar4].m_type;
    }
    begin._M_current = begin._M_current + 1;
  } while( true );
}

Assistant:

bool isValidTypePath (const VarType& type, Iterator begin, Iterator end)
{
	const VarType*	curType		= &type;
	Iterator		pathIter	= begin;

	// Process struct member and array element parts of path.
	while (pathIter != end)
	{
		if (pathIter->type == VarTypeComponent::STRUCT_MEMBER)
		{
			if (!curType->isStructType() || !de::inBounds(pathIter->index, 0, curType->getStructPtr()->getNumMembers()))
				return false;

			curType = &curType->getStructPtr()->getMember(pathIter->index).getType();
		}
		else if (pathIter->type == VarTypeComponent::ARRAY_ELEMENT)
		{
			if (!curType->isArrayType() || (curType->getArraySize() != VarType::UNSIZED_ARRAY && !de::inBounds(pathIter->index, 0, curType->getArraySize())))
				return false;

			curType = &curType->getElementType();
		}
		else
			break;

		++pathIter;
	}

	if (pathIter != end)
	{
		DE_ASSERT(pathIter->type == VarTypeComponent::MATRIX_COLUMN || pathIter->type == VarTypeComponent::VECTOR_COMPONENT);

		// Current type should be basic type.
		if (!curType->isBasicType())
			return false;

		DataType basicType = curType->getBasicType();

		if (pathIter->type == VarTypeComponent::MATRIX_COLUMN)
		{
			if (!isDataTypeMatrix(basicType))
				return false;

			basicType = getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType));
			++pathIter;
		}

		if (pathIter != end && pathIter->type == VarTypeComponent::VECTOR_COMPONENT)
		{
			if (!isDataTypeVector(basicType))
				return false;

			basicType = getDataTypeScalarType(basicType);
			++pathIter;
		}
	}

	return pathIter == end;
}